

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false> *essential,Scalar *tau,
          Scalar *workspace)

{
  float fVar1;
  SrcEvaluatorType *pSVar2;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  variable_if_dynamic<long,__1> *pvVar10;
  long *plVar11;
  ulong uVar12;
  float *pfVar13;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  false_type local_185;
  Scalar local_184;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_180;
  Scalar *local_160;
  SrcEvaluatorType *local_158;
  float *local_150;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false> *local_148;
  ulong local_140;
  Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
  local_138;
  undefined1 local_d0 [20];
  float fStack_bc;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *pMStack_b8;
  variable_if_dynamic<long,__1> local_b0;
  variable_if_dynamic<long,__1> vStack_a8;
  XprTypeNested local_a0;
  undefined1 local_98 [40];
  variable_if_dynamic<long,__1> vStack_70;
  XprTypeNested local_68;
  
  lVar6 = *(long *)(this + 8);
  if (lVar6 == 1) {
    if (*(long *)(this + 0x10) < 0) {
      pcVar7 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
      ;
      goto LAB_0017ada3;
    }
    local_d0._8_8_ = &local_180;
    local_180.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = (PointerType)
             CONCAT44(local_180.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data._4_4_,1.0 - *tau);
    local_138.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = *(PointerType *)this;
    local_d0._0_8_ = &local_138;
    local_138.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_cols.m_value = *(long *)(*(long *)(this + 0x18) + 8);
    unique0x00004e80 = (mul_assign_op<float,_float> *)&local_184;
    pMStack_b8 = this;
    internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
           *)local_d0);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    local_180.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = *(long *)(this + 0x10);
    local_180.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = workspace;
    if (local_180.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                    ,0xa6,
                    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, 1, -1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, 1, -1>>, Level = 0]"
                   );
    }
    local_138.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar6 - 1;
    local_138.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_data = (PointerType)(*(long *)this + 4);
    local_138.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
    .m_cols.m_value =
         local_180.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    if ((local_180.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value |
        local_138.
        super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
        .m_rows.m_value) < 0 && *(long *)this != 0) {
      pcVar7 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>, Level = 0]"
      ;
    }
    else {
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
      m_value = *(long *)(this + 0x10);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
           *(XprTypeNested *)(this + 0x18);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride = *(Index *)(this + 0x30);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow
      .m_value = *(long *)(this + 0x20);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol
      .m_value = *(long *)(this + 0x28);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = *(PointerType *)this;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value = *(long *)(this + 8);
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startRow.m_value = 1;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_138.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
      .m_outerStride =
           ((*(XprTypeNested *)(this + 0x18))->
           super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      if (lVar6 < 1) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_d0._8_8_ =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
           .m_rows.m_value;
      local_a0 = (XprTypeNested)
                 (essential->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                 .m_outerStride;
      local_b0.m_value =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
           m_startRow.m_value;
      vStack_a8.m_value =
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
           m_startCol.m_value;
      stack0xffffffffffffff40 =
           *(mul_assign_op<float,_float> **)
            &(essential->
             super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
             .field_0x10;
      pMStack_b8 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   (essential->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                   .m_xpr;
      local_d0._0_8_ =
           (DstEvaluatorType *)
           (essential->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
           .m_data;
      pvVar10 = (variable_if_dynamic<long,__1> *)&local_138;
      plVar11 = (long *)local_98;
      for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
        *plVar11 = pvVar10->m_value;
        pvVar10 = pvVar10 + 1;
        plVar11 = plVar11 + 1;
      }
      if (local_d0._8_8_ !=
          local_138.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                      ,0x62,
                      "Eigen::Product<Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>>, Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
                     );
      }
      if (local_180.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != local_98._16_8_) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow to resize.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseBase.h"
                      ,0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, 1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, 1, -1>>]"
                     );
      }
      uVar8 = local_180.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value;
      if ((((ulong)workspace & 3) == 0) &&
         (uVar8 = (ulong)(-((uint)((ulong)workspace >> 2) & 0x3fffffff) & 3),
         (ulong)local_180.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= uVar8)) {
        uVar8 = local_180.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
      }
      uVar9 = local_180.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value - uVar8;
      uVar12 = uVar9 + 3;
      if (-1 < (long)uVar9) {
        uVar12 = uVar9;
      }
      local_158 = (SrcEvaluatorType *)
                  local_138.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                  .m_rows.m_value;
      local_150 = tau;
      local_148 = essential;
      local_140 = local_180.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value;
      if (uVar8 != 0) {
        memset(workspace,0,uVar8 * 4);
      }
      lVar6 = (uVar12 & 0xfffffffffffffffc) + uVar8;
      if (3 < (long)uVar9) {
        lVar4 = uVar8 + 4;
        if ((long)(uVar8 + 4) < lVar6) {
          lVar4 = lVar6;
        }
        local_160 = workspace;
        memset(workspace + uVar8,0,(~uVar8 + lVar4 & 0xfffffffffffffffc) * 4 + 0x10);
        workspace = local_160;
      }
      uVar3 = local_140;
      if (lVar6 < (long)local_140) {
        memset(workspace + ((long)uVar12 >> 2) * 4 + uVar8,0,((long)uVar9 % 4) * 4);
      }
      local_184 = 1.0;
      internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>,-1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,7>
      ::scaleAndAddTo<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>
                (&local_180,
                 (Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                  *)local_d0,
                 (Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                  *)local_98,&local_184);
      pfVar5 = *(float **)this;
      uVar8 = *(ulong *)(this + 0x10);
      if (-1 < (long)uVar8 || pfVar5 == (float *)0x0) {
        if (*(long *)(this + 8) < 1) {
LAB_0017ac56:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<float, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if (local_180.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value != uVar8) {
          pcVar7 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, 1, -1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 1>, Functor = Eigen::internal::add_assign_op<float, float>]"
          ;
LAB_0017ad84:
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2f2,pcVar7);
        }
        if (0 < (long)uVar8) {
          lVar6 = *(long *)(*(long *)(this + 0x18) + 8);
          uVar12 = 0;
          pfVar13 = pfVar5;
          do {
            local_180.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data[uVar12] =
                 *pfVar13 +
                 local_180.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[uVar12];
            uVar12 = uVar12 + 1;
            pfVar13 = pfVar13 + lVar6;
          } while (uVar8 != uVar12);
        }
        if ((long)uVar8 < 0) {
          pcVar7 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, 1, -1>]"
          ;
        }
        else {
          if (*(long *)(this + 8) < 1) goto LAB_0017ac56;
          if (uVar8 != local_180.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value) {
            pcVar7 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, 1, -1>>, const Eigen::Map<Eigen::Matrix<float, 1, -1>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
            ;
            goto LAB_0017ad84;
          }
          if (0 < (long)uVar8) {
            fVar1 = *local_150;
            lVar6 = *(long *)(*(long *)(this + 0x18) + 8);
            uVar12 = 0;
            do {
              *pfVar5 = *pfVar5 - local_180.
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                  .
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                  .m_data[uVar12] * fVar1;
              uVar12 = uVar12 + 1;
              pfVar5 = pfVar5 + lVar6;
            } while (uVar8 != uVar12);
          }
          pSVar2 = (SrcEvaluatorType *)
                   (local_148->
                   super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                   ).
                   super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
                   .m_rows.m_value;
          if (-1 < (long)pSVar2) {
            pMStack_b8 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *
                         )(local_148->
                          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
                          .m_data;
            local_b0.m_value =
                 (local_148->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
                 .m_rows.m_value;
            vStack_a8.m_value =
                 *(long *)&(local_148->
                           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                           ).
                           super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
                           .field_0x10;
            local_a0 = (local_148->
                       super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                       .m_xpr;
            local_98._0_8_ =
                 (local_148->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                 .m_startRow.m_value;
            local_98._8_8_ =
                 (local_148->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                 .m_startCol.m_value;
            local_98._16_8_ =
                 (local_148->
                 super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                 .m_outerStride;
            stack0xffffffffffffff40 =
                 (mul_assign_op<float,_float> *)CONCAT44(*local_150,local_d0._16_4_);
            local_98._32_8_ =
                 local_180.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
            vStack_70.m_value =
                 local_180.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 ._8_8_;
            local_68 = (XprTypeNested)
                       local_180.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value;
            local_d0._8_8_ = pSVar2;
            if ((local_158 == (SrcEvaluatorType *)local_b0.m_value) &&
               (uVar3 == local_180.
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value)) {
              internal::
              outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<float,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                        (&local_138,
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                          *)local_d0,
                         (Map<Eigen::Matrix<float,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                         (local_98 + 0x20),(sub *)&local_184,&local_185);
              return;
            }
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/ProductEvaluators.h"
                          ,0xb0,
                          "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>, Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>>, Eigen::Map<Eigen::Matrix<float, 1, -1>>>, Eigen::internal::sub_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1>>, Eigen::Map<Eigen::Matrix<float, 1, -1>>>, Functor = Eigen::internal::sub_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                         );
          }
          pcVar7 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
          ;
        }
LAB_0017ada3:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,pcVar7);
      }
      pcVar7 = 
      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>>, 1>, Level = 0]"
      ;
    }
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar7);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}